

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationsettings.cpp
# Opt level: O0

int32_t __thiscall icu_63::CollationSettings::hashCode(CollationSettings *this)

{
  int local_18;
  uint local_14;
  int32_t i;
  int32_t h;
  CollationSettings *this_local;
  
  local_14 = this->options << 8;
  if ((this->options & 0xcU) != 0) {
    local_14 = this->variableTop ^ local_14;
  }
  local_14 = this->reorderCodesLength ^ local_14;
  for (local_18 = 0; local_18 < this->reorderCodesLength; local_18 = local_18 + 1) {
    local_14 = this->reorderCodes[local_18] << ((byte)local_18 & 0x1f) ^ local_14;
  }
  return local_14;
}

Assistant:

int32_t
CollationSettings::hashCode() const {
    int32_t h = options << 8;
    if((options & ALTERNATE_MASK) != 0) { h ^= variableTop; }
    h ^= reorderCodesLength;
    for(int32_t i = 0; i < reorderCodesLength; ++i) {
        h ^= (reorderCodes[i] << i);
    }
    return h;
}